

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::hasMoreTest<false>(IteratorTest *this)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  logic_error *plVar4;
  code *pcVar5;
  int iVar6;
  undefined *puVar7;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_f8;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_c8;
  undefined1 local_98 [16];
  size_t *local_88;
  size_t local_70;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_58;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_98._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
  local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.index_ = 0;
  local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.view_ = (view_pointer)0x0;
  local_f8.pointer_ = (pointer)0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            (&local_c8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_98,0);
  local_f8.index_ = local_c8.index_;
  local_f8.view_ = local_c8.view_;
  local_f8.pointer_ = local_c8.pointer_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_f8.coordinates_,&local_c8.coordinates_);
  if (local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar6 = 0x18;
  do {
    if (local_f8.view_ == (view_pointer)0x0) {
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar4,"Assertion failed.");
      pcVar5 = std::runtime_error::~runtime_error;
      puVar7 = &std::runtime_error::typeinfo;
LAB_001d6b09:
      __cxa_throw(plVar4,puVar7,pcVar5);
    }
    if (((local_f8.view_)->geometry_).size_ <= local_f8.index_) {
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar4,"test failed.");
      pcVar5 = std::logic_error::~logic_error;
      puVar7 = &std::logic_error::typeinfo;
      goto LAB_001d6b09;
    }
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_f8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (local_f8.view_ == (view_pointer)0x0) {
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar4,"Assertion failed.");
    pcVar5 = std::runtime_error::~runtime_error;
    puVar7 = &std::runtime_error::typeinfo;
  }
  else {
    if (((local_f8.view_)->geometry_).size_ <= local_f8.index_) {
      if (local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_88,local_70 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      local_98._0_8_ = this;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)&local_f8);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_98);
      local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.index_ = 0;
      local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.view_ = (view_pointer)0x0;
      local_f8.pointer_ = (pointer)0x0;
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_98);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_c8,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_98,0);
      puVar2 = local_f8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar1 = local_f8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8.index_ = local_c8.index_;
      local_f8.view_ = local_c8.view_;
      local_f8.pointer_ = local_c8.pointer_;
      local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
        if (local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      iVar6 = 0x18;
      do {
        if (local_f8.view_ == (view_pointer)0x0) {
          plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar4,"Assertion failed.");
          pcVar5 = std::runtime_error::~runtime_error;
          puVar7 = &std::runtime_error::typeinfo;
LAB_001d6b67:
          __cxa_throw(plVar4,puVar7,pcVar5);
        }
        if (((local_f8.view_)->geometry_).size_ <= local_f8.index_) {
          plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar4,"test failed.");
          pcVar5 = std::logic_error::~logic_error;
          puVar7 = &std::logic_error::typeinfo;
          goto LAB_001d6b67;
        }
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      if (local_f8.view_ == (view_pointer)0x0) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar4,"Assertion failed.");
        pcVar5 = std::runtime_error::~runtime_error;
        puVar7 = &std::runtime_error::typeinfo;
      }
      else {
        if (((local_f8.view_)->geometry_).size_ <= local_f8.index_) {
          if (local_f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          operator_delete(local_88,local_70 * 0x18);
          operator_delete(_Var3._M_current,8);
          _Var3._M_current = (unsigned_long *)operator_new(8);
          *_Var3._M_current = 0x18;
          local_98._0_8_ = this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_f8);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
          local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.index_ = 0;
          local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.view_ = (view_pointer)0x0;
          local_f8.pointer_ = (pointer)0x0;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    (&local_58,(View<int,_false,_std::allocator<unsigned_long>_> *)local_98,0);
          local_c8.view_ = local_58.view_;
          local_c8.pointer_ = local_58.pointer_;
          local_c8.index_ = local_58.index_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_c8.coordinates_,&local_58.coordinates_);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_c8);
          puVar2 = local_f8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar1 = local_f8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f8.index_ = local_c8.index_;
          local_f8.view_ = local_c8.view_;
          local_f8.pointer_ = local_c8.pointer_;
          local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
            if (local_c8.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_58.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          iVar6 = 0x18;
          do {
            if (local_f8.view_ == (view_pointer)0x0) {
              plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar4,"Assertion failed.");
              pcVar5 = std::runtime_error::~runtime_error;
              puVar7 = &std::runtime_error::typeinfo;
LAB_001d6bc5:
              __cxa_throw(plVar4,puVar7,pcVar5);
            }
            if (((local_f8.view_)->geometry_).size_ <= local_f8.index_) {
              plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar4,"test failed.");
              pcVar5 = std::logic_error::~logic_error;
              puVar7 = &std::logic_error::typeinfo;
              goto LAB_001d6bc5;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_f8);
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) {
              if (local_f8.view_ == (view_pointer)0x0) {
                plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar4,"Assertion failed.");
                pcVar5 = std::runtime_error::~runtime_error;
                puVar7 = &std::runtime_error::typeinfo;
              }
              else {
                if (((local_f8.view_)->geometry_).size_ <= local_f8.index_) {
                  if (local_f8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  operator_delete(local_88,local_70 * 0x18);
                  operator_delete(_Var3._M_current,8);
                  return;
                }
                plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar4,"test failed.");
                pcVar5 = std::logic_error::~logic_error;
                puVar7 = &std::logic_error::typeinfo;
              }
              __cxa_throw(plVar4,puVar7,pcVar5);
            }
          } while( true );
        }
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar4,"test failed.");
        pcVar5 = std::logic_error::~logic_error;
        puVar7 = &std::logic_error::typeinfo;
      }
      __cxa_throw(plVar4,puVar7,pcVar5);
    }
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar4,"test failed.");
    pcVar5 = std::logic_error::~logic_error;
    puVar7 = &std::logic_error::typeinfo;
  }
  __cxa_throw(plVar4,puVar7,pcVar5);
}

Assistant:

void IteratorTest::hasMoreTest() {
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.hasMore());
            ++it;
        }
        test(!it.hasMore());
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.hasMore());
            ++it;
        }
        test(!it.hasMore());
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.hasMore());
            ++it;
        }
        test(!it.hasMore());
    }
}